

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memops.c
# Opt level: O3

void dmrC_simplify_memops(dmr_C *C,entrypoint *ep)

{
  undefined8 uVar1;
  int iVar2;
  int iVar3;
  void *pvVar4;
  instruction *piVar5;
  instruction *piVar6;
  pseudo_t ppVar7;
  unsigned_long generation;
  undefined1 local_88 [8];
  ptr_list_iter bbiter__;
  undefined1 auStack_60 [8];
  ptr_list_iter insniter__;
  pseudo_list *dominators;
  
  ptrlist_reverse_iterator((ptr_list_iter *)local_88,(ptr_list *)ep->bbs);
  pvVar4 = ptrlist_iter_prev((ptr_list_iter *)local_88);
  uVar1 = bbiter__._16_8_;
  while (bbiter__._16_8_ = pvVar4, (void *)bbiter__._16_8_ != (void *)0x0) {
    ptrlist_reverse_iterator((ptr_list_iter *)auStack_60,*(ptr_list **)(bbiter__._16_8_ + 0x30));
    piVar5 = (instruction *)ptrlist_iter_prev((ptr_list_iter *)auStack_60);
    while (piVar5 != (instruction *)0x0) {
      if ((piVar5->bb != (basic_block *)0x0) && (*(char *)piVar5 == ')')) {
        ppVar7 = (piVar5->field_6).field_4.phi_src;
        iVar2 = local_pseudo(ppVar7);
        dmrC_check_access(C,piVar5);
        if ((*(byte *)((long)&piVar5->type->field_14 + 0x18) & 0x20) == 0) {
          insniter__._16_8_ = auStack_60;
          piVar6 = (instruction *)ptrlist_iter_prev((ptr_list_iter *)&insniter__.__nr);
          while (piVar6 != (instruction *)0x0) {
            if (piVar6->bb != (basic_block *)0x0) {
              iVar3 = dmrC_dominates(C,ppVar7,piVar5,piVar6,iVar2);
              if (iVar3 != 0) {
                if (-1 < iVar3) {
                  dmrC_convert_load_instruction(C,piVar5,(piVar6->field_5).target);
                  goto LAB_00133c9e;
                }
                if (*(char *)piVar6 != ')') goto LAB_00133c9e;
              }
            }
            piVar6 = (instruction *)ptrlist_iter_prev((ptr_list_iter *)&insniter__.__nr);
          }
          generation = C->L->bb_generation + 1;
          C->L->bb_generation = generation;
          ((basic_block *)bbiter__._16_8_)->generation = generation;
          insniter__.__nr = 0;
          insniter__._20_4_ = 0;
          iVar3 = find_dominating_parents
                            (C,ppVar7,piVar5,(basic_block *)bbiter__._16_8_,generation,
                             (pseudo_list **)&insniter__.__nr,iVar2);
          if (iVar3 != 0) {
            if (insniter__._16_8_ == 0) {
              if (iVar2 != 0) {
                if (ppVar7->type == PSEUDO_ARG) {
                  __assert_fail("pseudo->type != PSEUDO_ARG",
                                "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]dmr_c/src/memops.c"
                                ,0x80,"void simplify_loads(struct dmr_C *, struct basic_block *)");
                }
                ppVar7 = dmrC_value_pseudo(C,piVar5->type,0);
                dmrC_convert_load_instruction(C,piVar5,ppVar7);
              }
            }
            else {
              dmrC_rewrite_load_instruction(C,piVar5,(pseudo_list *)insniter__._16_8_);
            }
          }
        }
      }
LAB_00133c9e:
      piVar5 = (instruction *)ptrlist_iter_prev((ptr_list_iter *)auStack_60);
    }
    pvVar4 = ptrlist_iter_prev((ptr_list_iter *)local_88);
    uVar1 = bbiter__._16_8_;
  }
  bbiter__._16_8_ = uVar1;
  ptrlist_reverse_iterator((ptr_list_iter *)local_88,(ptr_list *)ep->bbs);
  pvVar4 = ptrlist_iter_prev((ptr_list_iter *)local_88);
  do {
    if (pvVar4 == (void *)0x0) {
      return;
    }
    ptrlist_reverse_iterator((ptr_list_iter *)auStack_60,*(ptr_list **)((long)pvVar4 + 0x30));
    piVar5 = (instruction *)ptrlist_iter_prev((ptr_list_iter *)auStack_60);
    while (piVar5 != (instruction *)0x0) {
      if ((piVar5->bb != (basic_block *)0x0) && (*(char *)piVar5 == '*')) {
        ppVar7 = (piVar5->field_6).field_4.phi_src;
        iVar2 = local_pseudo(ppVar7);
        insniter__._16_8_ = auStack_60;
        piVar6 = (instruction *)ptrlist_iter_prev((ptr_list_iter *)&insniter__.__nr);
        while (piVar6 != (instruction *)0x0) {
          if (piVar6->bb != (basic_block *)0x0) {
            iVar3 = dmrC_dominates(C,ppVar7,piVar5,piVar6,iVar2);
            if (iVar3 != 0) {
              if ((iVar3 < 0) || ((char)*(uint *)piVar6 == ')')) break;
              piVar6->bb = (basic_block *)0x0;
              *(uint *)piVar6 = *(uint *)piVar6 & 0xffffff00 | 0x39;
              dmrC_kill_use(C,&(piVar6->field_5).target);
            }
          }
          piVar6 = (instruction *)ptrlist_iter_prev((ptr_list_iter *)&insniter__.__nr);
        }
      }
      piVar5 = (instruction *)ptrlist_iter_prev((ptr_list_iter *)auStack_60);
    }
    pvVar4 = ptrlist_iter_prev((ptr_list_iter *)local_88);
  } while( true );
}

Assistant:

void dmrC_simplify_memops(struct dmr_C *C, struct entrypoint *ep)
{
	struct basic_block *bb;

	FOR_EACH_PTR_REVERSE(ep->bbs, bb) {
		simplify_loads(C, bb);
	} END_FOR_EACH_PTR_REVERSE(bb);

	FOR_EACH_PTR_REVERSE(ep->bbs, bb) {
		kill_dominated_stores(C, bb);
	} END_FOR_EACH_PTR_REVERSE(bb);
}